

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

void __thiscall wasm::Pusher::optimizeIntoIf(Pusher *this,Index firstPushable,Index pushPoint)

{
  Expression **ppEVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  bool local_679;
  undefined1 local_638 [8];
  anon_class_40_5_af6c749e maybePushInto;
  EffectAnalyzer *effects;
  Index index;
  LocalSet *pushable;
  Index i;
  Index i_1;
  EffectAnalyzer postIfEffects;
  EffectAnalyzer ifFalseEffects;
  EffectAnalyzer ifTrueEffects;
  undefined1 local_190 [8];
  EffectAnalyzer cumulativeEffects;
  If *iff;
  Index pushPoint_local;
  Index firstPushable_local;
  Pusher *this_local;
  
  bVar4 = false;
  if ((firstPushable != 0xffffffff) && (bVar4 = false, pushPoint != 0xffffffff)) {
    bVar4 = firstPushable < pushPoint;
  }
  if (bVar4) {
    ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this->list->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)pushPoint);
    cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)Expression::dynCast<wasm::If>(*ppEVar1);
    if ((If *)cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        (If *)0x0) {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_190,this->passOptions,this->module,
                 ((If *)cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count)->condition);
      EffectAnalyzer::ignoreControlFlowTransfers((EffectAnalyzer *)local_190);
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 this->passOptions,this->module,
                 *(Expression **)
                  (cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count + 0x18));
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 this->passOptions,this->module);
      if (*(long *)(cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count + 0x20) != 0) {
        EffectAnalyzer::walk
                  ((EffectAnalyzer *)
                   &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   *(Expression **)
                    (cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count + 0x20));
      }
      EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)&i,this->passOptions,this->module);
      for (pushable._4_4_ = pushPoint + 1; uVar3 = (ulong)pushable._4_4_,
          sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            (&this->list->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ), pushable._0_4_ = pushPoint, uVar3 < sVar2;
          pushable._4_4_ = pushable._4_4_ + 1) {
        ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this->list->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)pushable._4_4_);
        EffectAnalyzer::walk((EffectAnalyzer *)&i,*ppEVar1);
      }
      while ((Index)pushable != firstPushable) {
        if ((Index)pushable == 0) {
          __assert_fail("i > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodePushing.cpp"
                        ,0x143,"void wasm::Pusher::optimizeIntoIf(Index, Index)");
        }
        pushable._0_4_ = (Index)pushable - 1;
        ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this->list->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)(Index)pushable);
        _index = isPushable(this,*ppEVar1);
        local_679 = false;
        if (_index != (LocalSet *)0x0) {
          effects._4_4_ = 1;
          local_679 = wasm::Type::operator==
                                (&(_index->super_SpecificExpression<(wasm::Expression::Id)9>).
                                  super_Expression.type,(BasicType *)((long)&effects + 4));
        }
        if (local_679 != false) {
          _index = (LocalSet *)0x0;
        }
        if (_index == (LocalSet *)0x0) {
          ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this->list->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(ulong)(Index)pushable);
          EffectAnalyzer::walk((EffectAnalyzer *)local_190,*ppEVar1);
        }
        else {
          effects._0_4_ = _index->index;
          maybePushInto.i = (Index *)getPushableEffects(this,_index);
          bVar4 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)local_190,(EffectAnalyzer *)maybePushInto.i);
          if (bVar4) {
            ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this->list->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,(ulong)(Index)pushable);
            EffectAnalyzer::walk((EffectAnalyzer *)local_190,*ppEVar1);
          }
          else {
            local_638 = (undefined1  [8])&effects;
            maybePushInto.index = &i;
            maybePushInto.this = (Pusher *)&index;
            maybePushInto.pushable = &pushable;
            maybePushInto.postIfEffects = (EffectAnalyzer *)this;
            bVar4 = optimizeIntoIf::anon_class_40_5_af6c749e::operator()
                              ((anon_class_40_5_af6c749e *)local_638,
                               (Expression **)
                               (cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                ._M_node_count + 0x18),
                               *(Expression **)
                                (cumulativeEffects.delegateTargets._M_t._M_impl.
                                 super__Rb_tree_header._M_node_count + 0x20),
                               (EffectAnalyzer *)
                               &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,
                               (EffectAnalyzer *)
                               &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
            if ((!bVar4) &&
               (bVar4 = optimizeIntoIf::anon_class_40_5_af6c749e::operator()
                                  ((anon_class_40_5_af6c749e *)local_638,
                                   (Expression **)
                                   (cumulativeEffects.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count + 0x20),
                                   *(Expression **)
                                    (cumulativeEffects.delegateTargets._M_t._M_impl.
                                     super__Rb_tree_header._M_node_count + 0x18),
                                   (EffectAnalyzer *)
                                   &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                    ._M_node_count,
                                   (EffectAnalyzer *)
                                   &ifFalseEffects.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count), !bVar4)) {
              EffectAnalyzer::mergeIn((EffectAnalyzer *)local_190,(EffectAnalyzer *)maybePushInto.i)
              ;
            }
          }
        }
      }
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&i);
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_190);
    }
    return;
  }
  __assert_fail("firstPushable != Index(-1) && pushPoint != Index(-1) && firstPushable < pushPoint",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodePushing.cpp"
                ,0x10e,"void wasm::Pusher::optimizeIntoIf(Index, Index)");
}

Assistant:

void optimizeIntoIf(Index firstPushable, Index pushPoint) {
    assert(firstPushable != Index(-1) && pushPoint != Index(-1) &&
           firstPushable < pushPoint);

    auto* iff = list[pushPoint]->dynCast<If>();
    if (!iff) {
      return;
    }

    // Everything that matters if you want to be pushed past the pushPoint. This
    // begins with the if condition's effects, as we must always push past
    // those. Later, we will add to this when we need to.
    EffectAnalyzer cumulativeEffects(passOptions, module, iff->condition);

    // See optimizeSegment for why we can ignore control flow transfers here.
    cumulativeEffects.ignoreControlFlowTransfers();

    // Find the effects of the arms, which will affect what can be pushed.
    EffectAnalyzer ifTrueEffects(passOptions, module, iff->ifTrue);
    EffectAnalyzer ifFalseEffects(passOptions, module);
    if (iff->ifFalse) {
      ifFalseEffects.walk(iff->ifFalse);
    }

    // We need to know which locals are used after the if, as that can determine
    // if we can push or not.
    EffectAnalyzer postIfEffects(passOptions, module);
    for (Index i = pushPoint + 1; i < list.size(); i++) {
      postIfEffects.walk(list[i]);
    }

    // Start at the instruction right before the push point, and go back from
    // there:
    //
    //    x = op();
    //    y = op();
    //    if (..) {
    //      ..
    //    }
    //
    // Here we will try to push y first, and then x. Note that if we push y
    // then we can immediately try to push x after it, as it will remain in
    // order with x if we do. If we do *not* push y we can still try to push x
    // but we must move it past y, which means we need to check for interference
    // between them (which we do by adding y's effects to cumulativeEffects).
    //
    // Decrement at the top of the loop for simplicity, so start with i at one
    // past the first thing we can push (which is right before the push point).
    Index i = pushPoint;
    while (1) {
      if (i == firstPushable) {
        // We just finished processing the first thing that could be pushed;
        // stop.
        break;
      }
      assert(i > 0);
      i--;
      auto* pushable = isPushable(list[i]);
      if (pushable && pushable->type == Type::unreachable) {
        // Don't try to push something unreachable. If we did, then we'd need to
        // refinalize the block we are moving it from:
        //
        //  (block $unreachable
        //    (local.set $x (unreachable))
        //    (if (..)
        //      (.. (local.get $x))
        //  )
        //
        // The block should not be unreachable if the local.set is moved into
        // the if arm (the if arm may not execute, so the if itself will not
        // change type). It is simpler to avoid this complexity and leave this
        // to DCE to simplify first.
        //
        // (Note that the side effect of trapping will normally prevent us from
        // trying to push something unreachable, but in traps-never-happen mode
        // we are allowed to ignore that, and so we need this check.)
        pushable = nullptr;
      }
      if (!pushable) {
        // Something that is staying where it is, so anything we push later must
        // move past it. Note the effects and continue.
        cumulativeEffects.walk(list[i]);
        continue;
      }

      auto index = pushable->index;

      const auto& effects = getPushableEffects(pushable);

      if (cumulativeEffects.invalidates(effects)) {
        // This can't be moved forward. Add it to the things that are not
        // moving.
        cumulativeEffects.walk(list[i]);
        continue;
      }

      // We only try to push into an arm if the local is used there. If the
      // local is not used in either arm then we'll want to push it past the
      // entire if, which is what optimizeSegment handles.
      //
      // We can push into the if-true arm if the local cannot be used if we go
      // through the other arm:
      //
      //    x = op();
      //    if (..) {
      //      // we would like to move "x = op()" to here
      //      ..
      //    } else {
      //      use(x);
      //    }
      //    use(x);
      //
      // Either of those use(x)s would stop us from moving to if-true arm.
      //
      // One specific case we handle is if there is a use after the if but the
      // arm we don't push into is unreachable. In that case we only get to the
      // later code after going through the reachable arm, which is ok to push
      // into:
      //
      //    x = op();
      //    if (..) {
      //      // We'll push "x = op()" to here.
      //      use(x);
      //    } else {
      //      return;
      //    }
      //    use(x);
      auto maybePushInto = [&](Expression*& arm,
                               const Expression* otherArm,
                               EffectAnalyzer& armEffects,
                               const EffectAnalyzer& otherArmEffects) {
        if (!arm || !armEffects.localsRead.count(index) ||
            otherArmEffects.localsRead.count(index)) {
          // No arm, or this arm has no read of the index, or the other arm
          // reads the index.
          return false;
        }
        if (postIfEffects.localsRead.count(index) &&
            (!otherArm || otherArm->type != Type::unreachable)) {
          // The local is read later, which is bad, and there is no unreachable
          // in the other arm which as mentioned above is the only thing that
          // could have made it work out for us.
          return false;
        }

        // We can do it! Push into one of the if's arms, and put a nop where it
        // used to be.
        Builder builder(module);
        auto* block = builder.blockify(arm);
        arm = block;
        // TODO: this is quadratic in the number of pushed things
        ExpressionManipulator::spliceIntoBlock(block, 0, pushable);
        list[i] = builder.makeNop();

        // The code we pushed adds to the effects in that arm.
        armEffects.walk(pushable);

        // TODO: After pushing we could recurse and run both this function and
        //       optimizeSegment in that location. For now, leave that to later
        //       cycles of the optimizer, as this case seems rairly rare.
        return true;
      };

      if (!maybePushInto(
            iff->ifTrue, iff->ifFalse, ifTrueEffects, ifFalseEffects) &&
          !maybePushInto(
            iff->ifFalse, iff->ifTrue, ifFalseEffects, ifTrueEffects)) {
        // We didn't push this anywhere, so further pushables must pass it.
        cumulativeEffects.mergeIn(effects);
      }
    }
  }